

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_array.c
# Opt level: O0

void array_quantile_float(t_array_rangeop *x,t_floatarg f)

{
  float fVar1;
  int iVar2;
  float local_48;
  float local_44;
  double sum;
  int i;
  int arrayonset;
  int nitem;
  int stride;
  char *firstitem;
  char *itemp;
  t_array_rangeop *ptStack_10;
  t_floatarg f_local;
  t_array_rangeop *x_local;
  
  itemp._4_4_ = f;
  ptStack_10 = x;
  iVar2 = array_rangeop_getrange(x,(char **)&nitem,&i,&arrayonset,(int *)((long)&sum + 4));
  if (iVar2 != 0) {
    fVar1 = 0.0;
    firstitem = _nitem;
    for (sum._0_4_ = 0; sum._0_4_ < i; sum._0_4_ = sum._0_4_ + 1) {
      if (*(float *)firstitem <= 0.0) {
        local_44 = 0.0;
      }
      else {
        local_44 = *(float *)firstitem;
      }
      fVar1 = local_44 + fVar1;
      firstitem = firstitem + arrayonset;
    }
    fVar1 = itemp._4_4_ * fVar1;
    firstitem = _nitem;
    for (sum._0_4_ = 0; sum._0_4_ < i + -1; sum._0_4_ = sum._0_4_ + 1) {
      if (*(float *)firstitem <= 0.0) {
        local_48 = 0.0;
      }
      else {
        local_48 = *(float *)firstitem;
      }
      fVar1 = fVar1 - local_48;
      if (fVar1 < 0.0) break;
      firstitem = firstitem + arrayonset;
    }
    outlet_float((ptStack_10->x_tc).tc_obj.te_outlet,(float)sum._0_4_);
  }
  return;
}

Assistant:

static void array_quantile_float(t_array_rangeop *x, t_floatarg f)
{
    char *itemp, *firstitem;
    int stride, nitem, arrayonset, i;
    double sum;
    if (!array_rangeop_getrange(x, &firstitem, &nitem, &stride, &arrayonset))
        return;
    for (i = 0, sum = 0, itemp = firstitem; i < nitem; i++, itemp += stride)
        sum += (*(t_float *)itemp > 0? *(t_float *)itemp : 0);
    sum *= f;
    for (i = 0, itemp = firstitem; i < (nitem-1); i++, itemp += stride)
    {
        sum -= (*(t_float *)itemp > 0? *(t_float *)itemp : 0);
        if (sum < 0)
            break;
    }
    outlet_float(x->x_outlet, i);
}